

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O2

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  _func_int **pp_Var4;
  undefined1 auVar5 [16];
  int iVar6;
  _func_int *p_Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 (*pauVar11) [16];
  bool bVar12;
  float fVar13;
  undefined1 auVar14 [16];
  Mat local_78;
  
  iVar10 = bottom_top_blob->c;
  iVar9 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    iVar8 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    for (; iVar8 != iVar10; iVar8 = iVar8 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar8);
      pauVar11 = (undefined1 (*) [16])local_78.data;
      Mat::~Mat(&local_78);
      uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_Clip_x86[-3]);
      uVar2 = *(undefined4 *)(&this->field_0xd4 + (long)this->_vptr_Clip_x86[-3]);
      iVar6 = iVar9;
      while (bVar12 = iVar6 != 0, iVar6 = iVar6 + -1, bVar12) {
        auVar14._4_4_ = uVar1;
        auVar14._0_4_ = uVar1;
        auVar14._8_4_ = uVar1;
        auVar14._12_4_ = uVar1;
        auVar14 = maxps(*pauVar11,auVar14);
        auVar5._4_4_ = uVar2;
        auVar5._0_4_ = uVar2;
        auVar5._8_4_ = uVar2;
        auVar5._12_4_ = uVar2;
        auVar14 = minps(auVar14,auVar5);
        *pauVar11 = auVar14;
        pauVar11 = pauVar11 + 1;
      }
    }
  }
  else {
    iVar8 = 0;
    if (iVar10 < 1) {
      iVar10 = 0;
      iVar8 = 0;
    }
    for (; iVar8 != iVar10; iVar8 = iVar8 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar8);
      pauVar11 = (undefined1 (*) [16])local_78.data;
      Mat::~Mat(&local_78);
      pp_Var4 = this->_vptr_Clip_x86;
      for (iVar6 = iVar9; 0 < iVar6; iVar6 = iVar6 + -1) {
        p_Var7 = pp_Var4[-3];
        fVar3 = *(float *)(&this->field_0xd0 + (long)p_Var7);
        fVar13 = *(float *)*pauVar11;
        if (*(float *)*pauVar11 < fVar3) {
          *(float *)*pauVar11 = fVar3;
          p_Var7 = pp_Var4[-3];
          fVar13 = fVar3;
        }
        if (*(float *)(&this->field_0xd4 + (long)p_Var7) < fVar13) {
          *(float *)*pauVar11 = *(float *)(&this->field_0xd4 + (long)p_Var7);
        }
        pauVar11 = (undefined1 (*) [16])(*pauVar11 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _max = _mm256_set1_ps(max);
            __m256 _min = _mm256_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m256 _ptr = _mm256_loadu_ps(ptr);
                _ptr = _mm256_max_ps(_ptr, _min);
                _ptr = _mm256_min_ps(_ptr, _max);
                _mm256_storeu_ps(ptr, _ptr);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _max = _mm_set1_ps(max);
            __m128 _min = _mm_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m128 _ptr = _mm_loadu_ps(ptr);
                _ptr = _mm_max_ps(_ptr, _min);
                _ptr = _mm_min_ps(_ptr, _max);
                _mm_storeu_ps(ptr, _ptr);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int remain = size;
        for (; remain > 0; remain--)
        {
            if (*ptr < min)
                *ptr = min;

            if (*ptr > max)
                *ptr = max;

            ptr++;
        }
    }

    return 0;
}